

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O2

Vec_Ptr_t * Bac_NtkTransformToPtr(Bac_Ntk_t *p)

{
  Vec_Ptr_t *p_00;
  char *Entry;
  Vec_Ptr_t *pVVar1;
  
  p_00 = Vec_PtrAllocExact(5);
  Entry = Bac_ManStr(p->pDesign,p->NameId);
  Vec_PtrPush(p_00,Entry);
  pVVar1 = Bac_NtkTransformToPtrInputs(p);
  Vec_PtrPush(p_00,pVVar1);
  pVVar1 = Bac_NtkTransformToPtrOutputs(p);
  Vec_PtrPush(p_00,pVVar1);
  pVVar1 = Vec_PtrAllocExact(0);
  Vec_PtrPush(p_00,pVVar1);
  pVVar1 = Bac_NtkTransformToPtrBoxes(p);
  Vec_PtrPush(p_00,pVVar1);
  Ptr_CheckArray(p_00);
  return p_00;
}

Assistant:

Vec_Ptr_t * Bac_NtkTransformToPtr( Bac_Ntk_t * p )
{
    Vec_Ptr_t * vNtk = Vec_PtrAllocExact(5);
    Vec_PtrPush( vNtk, Bac_NtkName(p) );
    Vec_PtrPush( vNtk, Bac_NtkTransformToPtrInputs(p) );
    Vec_PtrPush( vNtk, Bac_NtkTransformToPtrOutputs(p) );
    Vec_PtrPush( vNtk, Vec_PtrAllocExact(0) );
    Vec_PtrPush( vNtk, Bac_NtkTransformToPtrBoxes(p) );
    assert( Ptr_CheckArray(vNtk) );
    return vNtk;
}